

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::FboRenderCase::iterate(FboRenderCase *this)

{
  ContextType *this_00;
  int iVar1;
  RenderContext *context_00;
  TestLog *log;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  char *pcVar7;
  char *pcVar8;
  int height;
  int width;
  bool bVar9;
  Surface refFrame;
  Surface gles3Frame;
  ReferenceContextBuffers buffers;
  deRandom rnd;
  code *local_62b0;
  deUint32 local_62a8;
  MultisamplePixelBufferAccess local_6258;
  MultisamplePixelBufferAccess local_6230;
  MultisamplePixelBufferAccess local_6208;
  GLContext context;
  int *piVar6;
  
  context_00 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar3 = (*context_00->_vptr_RenderContext[4])(context_00);
  piVar6 = (int *)CONCAT44(extraout_var,iVar3);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd,dVar4);
  iVar3 = *piVar6;
  width = 0x80;
  if (iVar3 < 0x80) {
    width = iVar3;
  }
  iVar1 = piVar6[1];
  height = 0x80;
  if (iVar1 < 0x80) {
    height = iVar1;
  }
  dVar4 = deRandom_getUint32(&rnd);
  dVar5 = deRandom_getUint32(&rnd);
  tcu::Surface::Surface(&gles3Frame,width,height);
  tcu::Surface::Surface(&refFrame,width,height);
  buffers.m_colorbuffer.m_format.type = dVar5 % ((iVar1 - height) + 1U);
  buffers.m_colorbuffer.m_format.order = dVar4 % ((iVar3 - width) + 1U);
  buffers.m_colorbuffer.m_size.m_data[0] = width;
  buffers.m_colorbuffer.m_size.m_data[1] = height;
  sglr::GLContext::GLContext(&context,context_00,log,1,(IVec4 *)&buffers);
  sglr::GLContext::clearColor(&context,0.125,0.25,0.5,1.0);
  sglr::GLContext::clear(&context,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,&context,&gles3Frame);
  dVar4 = sglr::GLContext::getError(&context);
  sglr::GLContext::~GLContext(&context);
  context.super_Context._12_4_ = (uint)(piVar6[5] != 0) << 3;
  context.super_Context._vptr_Context = (_func_int **)0x800000008;
  context.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&buffers,(PixelFormat *)&context,piVar6[6],piVar6[7],width,height,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits
            ((ReferenceContextLimits *)&local_62b0,context_00);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_6208,&buffers);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6230,&buffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_6258,&buffers);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)&context,(ReferenceContextLimits *)&local_62b0,&local_6208,
             &local_6230,&local_6258);
  sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)&local_62b0);
  sglr::ReferenceContext::clearColor((ReferenceContext *)&context,0.125,0.25,0.5,1.0);
  sglr::ReferenceContext::clear((ReferenceContext *)&context,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,&context,&refFrame)
  ;
  dVar5 = sglr::ReferenceContext::getError((ReferenceContext *)&context);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)&context);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
  if (dVar4 == dVar5) {
    pcVar7 = (char *)0x0;
  }
  else {
    this_00 = &context.super_Context.m_type;
    context.super_Context._vptr_Context = (_func_int **)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Error code mismatch: got ");
    buffers.m_colorbuffer.m_format = (TextureFormat)glu::getErrorName;
    buffers.m_colorbuffer.m_size.m_data[0] = dVar4;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&buffers,(ostream *)this_00);
    std::operator<<((ostream *)this_00,", expected ");
    local_62b0 = glu::getErrorName;
    local_62a8 = dVar5;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_62b0,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&context,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    pcVar7 = "Got unexpected error";
  }
  bVar2 = compare(this,&refFrame,&gles3Frame);
  bVar9 = dVar4 != dVar5;
  pcVar8 = "Image comparison failed";
  if (bVar9) {
    pcVar8 = pcVar7;
  }
  if (bVar2) {
    pcVar8 = pcVar7;
  }
  pcVar7 = "Pass";
  if (bVar9 || !bVar2) {
    pcVar7 = pcVar8;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar9 || !bVar2),
             pcVar7);
  tcu::Surface::~Surface(&refFrame);
  tcu::Surface::~Surface(&gles3Frame);
  return STOP;
}

Assistant:

TestCase::IterateResult FboRenderCase::iterate (void)
{
	tcu::Vec4					clearColor				= tcu::Vec4(0.125f, 0.25f, 0.5f, 1.0f);
	glu::RenderContext&			renderCtx				= m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();
	const char*					failReason				= DE_NULL;

	// Position & size for context
	deRandom rnd;
	deRandom_init(&rnd, deStringHash(getName()));

	int		width	= deMin32(renderTarget.getWidth(), 128);
	int		height	= deMin32(renderTarget.getHeight(), 128);
	int		xMax	= renderTarget.getWidth()-width+1;
	int		yMax	= renderTarget.getHeight()-height+1;
	int		x		= deRandom_getUint32(&rnd) % xMax;
	int		y		= deRandom_getUint32(&rnd) % yMax;

	tcu::Surface	gles3Frame	(width, height);
	tcu::Surface	refFrame	(width, height);
	GLenum			gles3Error;
	GLenum			refError;

	// Render using GLES3
	try
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context, gles3Frame); // Call actual render func
		gles3Error = context.getError();
	}
	catch (const FboIncompleteException& e)
	{
		if (e.getReason() == GL_FRAMEBUFFER_UNSUPPORTED)
		{
			// Mark test case as unsupported
			log << e;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		else
			throw; // Propagate error
	}

	// Render reference image
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context, refFrame);
		refError = context.getError();
	}

	// Compare error codes
	bool errorCodesOk = (gles3Error == refError);

	if (!errorCodesOk)
	{
		log << tcu::TestLog::Message << "Error code mismatch: got " << glu::getErrorStr(gles3Error) << ", expected " << glu::getErrorStr(refError) << tcu::TestLog::EndMessage;
		failReason = "Got unexpected error";
	}

	// Compare images
	bool imagesOk = compare(refFrame, gles3Frame);

	if (!imagesOk && !failReason)
		failReason = "Image comparison failed";

	// Store test result
	bool isOk = errorCodesOk && imagesOk;
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: failReason);

	return STOP;
}